

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

Boxed_Value
chaiscript::Boxed_Number::const_binary_int_go<unsigned_short>
          (Opers t_oper,unsigned_short *t,unsigned_short *u)

{
  undefined8 uVar1;
  bad_any_cast *this;
  type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  int in_ESI;
  element_type *in_RDI;
  Boxed_Value BVar3;
  int *in_stack_ffffffffffffffa8;
  
  this = (bad_any_cast *)(ulong)(in_ESI - 0x17);
  switch(this) {
  case (bad_any_cast *)0x0:
    BVar3 = const_var<int>(in_stack_ffffffffffffffa8);
    _Var2._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case (bad_any_cast *)0x1:
    BVar3 = const_var<int>(in_stack_ffffffffffffffa8);
    _Var2._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case (bad_any_cast *)0x2:
    check_divide_by_zero<unsigned_short>((unsigned_short)((uint)in_ESI >> 0x10),in_RDX);
    BVar3 = const_var<int>(in_stack_ffffffffffffffa8);
    _Var2._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case (bad_any_cast *)0x3:
    BVar3 = const_var<int>(in_stack_ffffffffffffffa8);
    _Var2._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case (bad_any_cast *)0x4:
    BVar3 = const_var<int>(in_stack_ffffffffffffffa8);
    _Var2._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case (bad_any_cast *)0x5:
    BVar3 = const_var<int>(in_stack_ffffffffffffffa8);
    _Var2._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  default:
    uVar1 = __cxa_allocate_exception(0x28);
    chaiscript::detail::exception::bad_any_cast::bad_any_cast(this);
    __cxa_throw(uVar1,&chaiscript::detail::exception::bad_any_cast::typeinfo,
                chaiscript::detail::exception::bad_any_cast::~bad_any_cast);
  }
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value const_binary_int_go(Operators::Opers t_oper, const T &t, const T &u) 
      {
        switch (t_oper)
        {
          case Operators::shift_left:
            return const_var(t << u);
          case Operators::shift_right:
            return const_var(t >> u);
          case Operators::remainder:
            check_divide_by_zero(u);
            return const_var(t % u);
          case Operators::bitwise_and:
            return const_var(t & u);
          case Operators::bitwise_or:
            return const_var(t | u);
          case Operators::bitwise_xor:
            return const_var(t ^ u);
          default:
            throw chaiscript::detail::exception::bad_any_cast();
        }
      }